

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O3

void ExchCXX::detail::host_eval_exc_helper_polar<ExchCXX::BuiltinSCANL_C>
               (int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps)

{
  long lVar1;
  double *pdVar2;
  
  if (0 < N) {
    pdVar2 = sigma + 2;
    lVar1 = 0;
    do {
      kernel_traits<ExchCXX::Deorbitalized<ExchCXX::BuiltinSCAN_C,_ExchCXX::BuiltinPC07OPT_K>_>::
      eval_exc_polar(*(double *)((long)rho + lVar1 * 2),*(double *)((long)rho + lVar1 * 2 + 8),
                     pdVar2[-2],pdVar2[-1],*pdVar2,*(double *)((long)lapl + lVar1 * 2),
                     *(double *)((long)lapl + lVar1 * 2 + 8),*(double *)((long)tau + lVar1 * 2),
                     *(double *)((long)tau + lVar1 * 2 + 8),(double *)(lVar1 + (long)eps));
      pdVar2 = pdVar2 + 3;
      lVar1 = lVar1 + 8;
    } while ((ulong)(uint)N << 3 != lVar1);
  }
  return;
}

Assistant:

MGGA_EXC_GENERATOR( host_eval_exc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i   = rho   + 2*i;
    auto* sigma_i = sigma + 3*i;
    auto* tau_i   = tau   + 2*i;
    auto* lapl_i  = lapl  + 2*i;

    const auto lapl_i_a = traits::needs_laplacian ? lapl_i[0] : 0.0;
    const auto lapl_i_b = traits::needs_laplacian ? lapl_i[1] : 0.0;
   
    traits::eval_exc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], lapl_i_a, lapl_i_b, tau_i[0], tau_i[1], 
      eps[i] );

  }

}